

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall Json::StyledWriter::indent(StyledWriter *this)

{
  int iVar1;
  allocator local_31;
  string local_30 [32];
  StyledWriter *local_10;
  StyledWriter *this_local;
  
  iVar1 = this->indentSize_;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,(long)iVar1,' ',&local_31);
  std::__cxx11::string::operator+=((string *)&this->indentString_,local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

void StyledWriter::indent() { indentString_ += std::string(indentSize_, ' '); }